

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O0

bool __thiscall blcl::net::server_interface<MsgType>::start(server_interface<MsgType> *this)

{
  exception *e;
  thread local_30 [3];
  server_interface<MsgType> *local_18;
  server_interface<MsgType> *this_local;
  
  local_18 = this;
  wait_for_client_connection(this);
  e = (exception *)this;
  std::thread::thread<blcl::net::server_interface<MsgType>::start()::_lambda()_1_,,void>
            (local_30,(type *)&e);
  std::thread::operator=(&this->ctx_thread_,local_30);
  std::thread::~thread(local_30);
  std::operator<<((ostream *)&std::cout,"[INFO] Server started!\n");
  return true;
}

Assistant:

bool start() {
            try {
                wait_for_client_connection();
                ctx_thread_ = std::thread([this]() { context_.run(); });
            } catch (std::exception& e) {
                std::cerr << "[ERR] Exception: " << e.what() << "\n";
                return false;
            }

            std::cout << "[INFO] Server started!\n";
            return true;
        }